

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::visitUnary
          (TGlslangToSpvTraverser *this,TVisit param_1,TIntermUnary *node)

{
  Op OVar1;
  SpvBuildLogger *this_00;
  initializer_list<unsigned_int> __l;
  initializer_list<spv::IdImmediate> __l_00;
  initializer_list<spv::IdImmediate> __l_01;
  bool bVar2;
  int iVar3;
  Id IVar4;
  TOperator TVar5;
  EShSource EVar6;
  Id IVar7;
  CoherentFlags CVar8;
  TPrecisionQualifier glslangPrecision;
  Decoration DVar9;
  Decoration noContraction;
  Decoration nonUniform;
  TBasicType TVar10;
  TBasicType operandBasicType;
  Id typeId_00;
  undefined4 extraout_var;
  TSourceLoc *this_01;
  char *pcVar11;
  long *plVar12;
  TQualifier *pTVar13;
  TType *pTVar14;
  TIntermConstantUnion *this_02;
  TConstUnionArray *this_03;
  TConstUnion *this_04;
  TIntermTyped *pTVar15;
  TType *right;
  TSpirvInstruction *__lhs;
  reference pvVar16;
  Id local_354;
  allocator<char> local_2b1;
  string local_2b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_290;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_278;
  AccessChain local_260;
  Id local_204;
  TOperator local_200;
  Id result_1;
  TOperator op;
  Id one;
  iterator local_1f0;
  size_type local_1e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e0;
  allocator<spv::IdImmediate> local_1c1;
  IdImmediate local_1c0;
  iterator local_1b8;
  size_type local_1b0;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> local_1a8;
  allocator<spv::IdImmediate> local_189;
  IdImmediate local_188;
  iterator local_180;
  size_type local_178;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> local_170;
  IdImmediate local_158;
  value_type local_150;
  undefined1 local_148 [8];
  TVector<const_glslang::TIntermConstantUnion_*> constants;
  vector<unsigned_int,_std::allocator<unsigned_int>_> literals;
  IdImmediate idImmOp;
  TSpirvInstruction *spirvInst;
  OpDecorations decorations;
  AccessChain local_e8;
  anon_class_1_0_00000001 local_89;
  CoherentFlags local_88;
  Id IStack_84;
  anon_class_1_0_00000001 hitObjectOpsWithLvalue;
  CoherentFlags lvalueCoherentFlags;
  Id operand;
  TIntermNode *operandNode;
  anon_class_24_3_db054092 resultType;
  Id invertedType;
  uint member;
  TIntermTyped *block;
  Id typeId_1;
  Id typeId;
  Id length;
  undefined1 local_38 [4];
  Id result;
  SpecConstantOpModeGuard spec_constant_op_mode_setter;
  TIntermUnary *node_local;
  TVisit param_1_local;
  TGlslangToSpvTraverser *this_local;
  
  spec_constant_op_mode_setter._8_8_ = node;
  iVar3 = (**(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode)()
  ;
  iVar3 = *(int *)(CONCAT44(extraout_var,iVar3) + 0xc);
  this_01 = (TSourceLoc *)(*(code *)**(undefined8 **)spec_constant_op_mode_setter._8_8_)();
  pcVar11 = glslang::TSourceLoc::getFilename(this_01);
  spv::Builder::setDebugSourceLocation(&this->builder,iVar3,pcVar11);
  anon_unknown_0::SpecConstantOpModeGuard::SpecConstantOpModeGuard
            ((SpecConstantOpModeGuard *)local_38,&this->builder);
  plVar12 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0xf0))();
  pTVar13 = (TQualifier *)(**(code **)(*plVar12 + 0x58))();
  bVar2 = glslang::TQualifier::isSpecConstant(pTVar13);
  if (bVar2) {
    anon_unknown_0::SpecConstantOpModeGuard::turnOnSpecConstantOpMode
              ((SpecConstantOpModeGuard *)local_38);
  }
  IVar4 = createImageTextureFunctionCall(this,(TIntermOperator *)spec_constant_op_mode_setter._8_8_)
  ;
  if (IVar4 != 0) {
    spv::Builder::clearAccessChain(&this->builder);
    spv::Builder::setAccessChainRValue(&this->builder,IVar4);
    this_local._7_1_ = false;
    goto LAB_005bbb86;
  }
  TVar5 = glslang::TIntermOperator::getOp((TIntermOperator *)spec_constant_op_mode_setter._8_8_);
  if (TVar5 == EOpArrayLength) {
    plVar12 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x188))();
    pTVar14 = (TType *)(**(code **)(*plVar12 + 0xf0))();
    bVar2 = glslang::TType::isCoopMat(pTVar14);
    if (bVar2) {
      plVar12 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x188))();
      pTVar14 = (TType *)(**(code **)(*plVar12 + 0xf0))();
      IVar4 = convertGlslangToSpvType(this,pTVar14,false);
      bVar2 = spv::Builder::isCooperativeMatrixType(&this->builder,IVar4);
      if (!bVar2) {
        __assert_fail("builder.isCooperativeMatrixType(typeId)",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                      ,0xa30,
                      "virtual bool (anonymous namespace)::TGlslangToSpvTraverser::visitUnary(glslang::TVisit, glslang::TIntermUnary *)"
                     );
      }
      plVar12 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x188))();
      pTVar14 = (TType *)(**(code **)(*plVar12 + 0xf0))();
      bVar2 = glslang::TType::isCoopMatKHR(pTVar14);
      if (bVar2) {
        typeId_1 = spv::Builder::createCooperativeMatrixLengthKHR(&this->builder,IVar4);
      }
      else {
        anon_unknown_0::SpecConstantOpModeGuard::turnOnSpecConstantOpMode
                  ((SpecConstantOpModeGuard *)local_38);
        typeId_1 = spv::Builder::createCooperativeMatrixLengthNV(&this->builder,IVar4);
      }
    }
    else {
      plVar12 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x188))();
      pTVar14 = (TType *)(**(code **)(*plVar12 + 0xf0))();
      bVar2 = glslang::TType::isCoopVecNV(pTVar14);
      if (bVar2) {
        plVar12 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x188))();
        pTVar14 = (TType *)(**(code **)(*plVar12 + 0xf0))();
        IVar4 = convertGlslangToSpvType(this,pTVar14,false);
        typeId_1 = spv::Builder::getCooperativeVectorNumComponents(&this->builder,IVar4);
      }
      else {
        plVar12 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x188))();
        plVar12 = (long *)(**(code **)(*plVar12 + 0x40))();
        plVar12 = (long *)(**(code **)(*plVar12 + 400))();
        (**(code **)(*plVar12 + 0x10))(plVar12,this);
        plVar12 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x188))();
        plVar12 = (long *)(**(code **)(*plVar12 + 0x40))();
        plVar12 = (long *)(**(code **)(*plVar12 + 0x198))();
        this_02 = (TIntermConstantUnion *)(**(code **)(*plVar12 + 0x28))();
        this_03 = glslang::TIntermConstantUnion::getConstArray(this_02);
        this_04 = glslang::TConstUnionArray::operator[](this_03,0);
        resultType.this._4_4_ = glslang::TConstUnion::getUConst(this_04);
        IVar4 = spv::Builder::accessChainGetLValue(&this->builder);
        typeId_1 = spv::Builder::createArrayLength(&this->builder,IVar4,resultType.this._4_4_);
      }
    }
    EVar6 = glslang::TIntermediate::getSource(this->glslangIntermediate);
    if (EVar6 == EShSourceGlsl) {
      bVar2 = spv::Builder::isInSpecConstCodeGenMode(&this->builder);
      if (bVar2) {
        IVar4 = spv::Builder::makeIntType(&this->builder,0x20);
        IVar7 = spv::Builder::makeIntConstant(&this->builder,0,false);
        typeId_1 = spv::Builder::createBinOp(&this->builder,OpIAdd,IVar4,typeId_1,IVar7);
      }
      else {
        IVar4 = spv::Builder::makeIntType(&this->builder,0x20);
        typeId_1 = spv::Builder::createUnaryOp(&this->builder,OpBitcast,IVar4,typeId_1);
      }
    }
    spv::Builder::clearAccessChain(&this->builder);
    spv::Builder::setAccessChainRValue(&this->builder,typeId_1);
    this_local._7_1_ = false;
    goto LAB_005bbb86;
  }
  TVar5 = glslang::TIntermOperator::getOp((TIntermOperator *)spec_constant_op_mode_setter._8_8_);
  if (TVar5 == EOpDeclare) {
    spv::Builder::clearAccessChain(&this->builder);
    plVar12 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x188))();
    (**(code **)(*plVar12 + 0x10))(plVar12,this);
    spv::Builder::clearAccessChain(&this->builder);
    this_local._7_1_ = false;
    goto LAB_005bbb86;
  }
  resultType.this._0_4_ = 0;
  operandNode = (TIntermNode *)&resultType.this;
  resultType.invertedType = (Id *)&spec_constant_op_mode_setter.previous_flag_;
  resultType.node = (TIntermUnary **)this;
  TVar5 = glslang::TIntermOperator::getOp((TIntermOperator *)spec_constant_op_mode_setter._8_8_);
  if (TVar5 == EOpInterpolateAtCentroid) {
    pTVar15 = (TIntermTyped *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x188))();
    resultType.this._0_4_ = getInvertedSwizzleType(this,pTVar15);
  }
  spv::Builder::clearAccessChain(&this->builder);
  if ((Id)resultType.this == 0) {
    _lvalueCoherentFlags =
         (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x188))();
  }
  else {
    plVar12 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x188))();
    plVar12 = (long *)(**(code **)(*plVar12 + 0x40))();
    _lvalueCoherentFlags = (long *)(**(code **)(*plVar12 + 400))();
  }
  (**(code **)(*_lvalueCoherentFlags + 0x10))(_lvalueCoherentFlags,this);
  IStack_84 = 0;
  spv::Builder::AccessChain::CoherentFlags::CoherentFlags(&local_88);
  TVar5 = glslang::TIntermOperator::getOp((TIntermOperator *)spec_constant_op_mode_setter._8_8_);
  if ((((((TVar5 == EOpAtomicCounterIncrement) ||
         (TVar5 = glslang::TIntermOperator::getOp
                            ((TIntermOperator *)spec_constant_op_mode_setter._8_8_),
         TVar5 == EOpAtomicCounterDecrement)) ||
        (TVar5 = glslang::TIntermOperator::getOp
                           ((TIntermOperator *)spec_constant_op_mode_setter._8_8_),
        TVar5 == EOpAtomicCounter)) ||
       ((TVar5 = glslang::TIntermOperator::getOp
                           ((TIntermOperator *)spec_constant_op_mode_setter._8_8_),
        TVar5 == EOpInterpolateAtCentroid &&
        (EVar6 = glslang::TIntermediate::getSource(this->glslangIntermediate),
        EVar6 != EShSourceHlsl)))) ||
      ((TVar5 = glslang::TIntermOperator::getOp
                          ((TIntermOperator *)spec_constant_op_mode_setter._8_8_),
       TVar5 == EOpRayQueryProceed ||
       ((TVar5 = glslang::TIntermOperator::getOp
                           ((TIntermOperator *)spec_constant_op_mode_setter._8_8_),
        TVar5 == EOpRayQueryGetRayTMin ||
        (TVar5 = glslang::TIntermOperator::getOp
                           ((TIntermOperator *)spec_constant_op_mode_setter._8_8_),
        TVar5 == EOpRayQueryGetRayFlags)))))) ||
     ((TVar5 = glslang::TIntermOperator::getOp
                         ((TIntermOperator *)spec_constant_op_mode_setter._8_8_),
      TVar5 == EOpRayQueryGetWorldRayOrigin ||
      ((((TVar5 = glslang::TIntermOperator::getOp
                            ((TIntermOperator *)spec_constant_op_mode_setter._8_8_),
         TVar5 == EOpRayQueryGetWorldRayDirection ||
         (TVar5 = glslang::TIntermOperator::getOp
                            ((TIntermOperator *)spec_constant_op_mode_setter._8_8_),
         TVar5 == EOpRayQueryGetIntersectionCandidateAABBOpaque)) ||
        (TVar5 = glslang::TIntermOperator::getOp
                           ((TIntermOperator *)spec_constant_op_mode_setter._8_8_),
        TVar5 == EOpRayQueryTerminate)) ||
       (TVar5 = glslang::TIntermOperator::getOp
                          ((TIntermOperator *)spec_constant_op_mode_setter._8_8_),
       TVar5 == EOpRayQueryConfirmIntersection)))))) {
LAB_005bac7a:
    IStack_84 = spv::Builder::accessChainGetLValue(&this->builder);
    spv::Builder::getAccessChain(&local_e8,&this->builder);
    local_88._0_2_ = local_e8.coherentFlags._0_2_;
    spv::Builder::AccessChain::~AccessChain(&local_e8);
    plVar12 = (long *)(**(code **)(*_lvalueCoherentFlags + 0x18))();
    pTVar14 = (TType *)(**(code **)(*plVar12 + 0xf0))();
    CVar8 = TranslateCoherent(this,pTVar14);
    decorations.nonUniform._0_2_ = CVar8._0_2_;
    decorations.noContraction =
         (Decoration)
         spv::Builder::AccessChain::CoherentFlags::operator|=
                   (&local_88,(CoherentFlags *)&decorations.nonUniform);
  }
  else {
    TVar5 = glslang::TIntermOperator::getOp((TIntermOperator *)spec_constant_op_mode_setter._8_8_);
    if (TVar5 == EOpSpirvInst) {
      plVar12 = (long *)(**(code **)(*_lvalueCoherentFlags + 0x18))();
      pTVar13 = (TQualifier *)(**(code **)(*plVar12 + 0x108))();
      bVar2 = glslang::TQualifier::isSpirvByReference(pTVar13);
      if (bVar2) goto LAB_005bac7a;
    }
    TVar5 = glslang::TIntermOperator::getOp((TIntermOperator *)spec_constant_op_mode_setter._8_8_);
    bVar2 = visitUnary::anon_class_1_0_00000001::operator()(&local_89,TVar5);
    if (bVar2) goto LAB_005bac7a;
    plVar12 = (long *)(**(code **)(*_lvalueCoherentFlags + 0x18))();
    pTVar13 = (TQualifier *)(**(code **)(*plVar12 + 0x108))();
    bVar2 = glslang::TQualifier::isSpirvLiteral(pTVar13);
    if (bVar2) {
      IStack_84 = 0;
    }
    else {
      plVar12 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x188))();
      pTVar14 = (TType *)(**(code **)(*plVar12 + 0xf0))();
      IStack_84 = accessChainLoad(this,pTVar14);
    }
  }
  glslangPrecision =
       glslang::TIntermOperator::getOperationPrecision
                 ((TIntermOperator *)spec_constant_op_mode_setter._8_8_);
  DVar9 = TranslatePrecisionDecoration(glslangPrecision);
  plVar12 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0xf0))();
  pTVar13 = (TQualifier *)(**(code **)(*plVar12 + 0x58))();
  noContraction = TranslateNoContractionDecoration(pTVar13);
  plVar12 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0xf0))();
  pTVar13 = (TQualifier *)(**(code **)(*plVar12 + 0x58))();
  nonUniform = TranslateNonUniformDecoration(this,pTVar13);
  anon_unknown_0::OpDecorations::OpDecorations
            ((OpDecorations *)((long)&spirvInst + 4),DVar9,noContraction,nonUniform);
  TVar5 = glslang::TIntermOperator::getOp((TIntermOperator *)spec_constant_op_mode_setter._8_8_);
  IVar7 = visitUnary::anon_class_24_3_db054092::operator()((anon_class_24_3_db054092 *)&operandNode)
  ;
  IVar4 = IStack_84;
  plVar12 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0xf0))();
  TVar10 = (**(code **)(*plVar12 + 0x38))();
  plVar12 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x188))();
  operandBasicType = (**(code **)(*plVar12 + 0x100))();
  length = createConversion(this,TVar5,(OpDecorations *)((long)&spirvInst + 4),IVar7,IVar4,TVar10,
                            operandBasicType);
  if (length != 0) {
    pTVar14 = (TType *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0xf0))();
    bVar2 = glslang::TType::isCoopMatKHR(pTVar14);
    if (bVar2) {
      plVar12 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x188))();
      plVar12 = (long *)(**(code **)(*plVar12 + 0x18))();
      pTVar14 = (TType *)(**(code **)(*plVar12 + 0xf0))();
      bVar2 = glslang::TType::isCoopMatKHR(pTVar14);
      if (bVar2) {
        plVar12 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x18))();
        pTVar14 = (TType *)(**(code **)(*plVar12 + 0xf0))();
        plVar12 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x188))();
        plVar12 = (long *)(**(code **)(*plVar12 + 0x18))();
        right = (TType *)(**(code **)(*plVar12 + 0xf0))();
        bVar2 = glslang::TType::sameCoopMatUse(pTVar14,right);
        if (!bVar2) {
          spv::Builder::addCapability(&this->builder,CapabilityCooperativeMatrixConversionsNV);
          spv::Builder::addExtension(&this->builder,"SPV_NV_cooperative_matrix2");
        }
      }
    }
  }
  if (length == 0) {
    TVar5 = glslang::TIntermOperator::getOp((TIntermOperator *)spec_constant_op_mode_setter._8_8_);
    IVar7 = visitUnary::anon_class_24_3_db054092::operator()
                      ((anon_class_24_3_db054092 *)&operandNode);
    IVar4 = IStack_84;
    plVar12 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x188))();
    TVar10 = (**(code **)(*plVar12 + 0x100))();
    pTVar14 = (TType *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0xf0))();
    length = createUnaryOperation
                       (this,TVar5,(OpDecorations *)((long)&spirvInst + 4),IVar7,IVar4,TVar10,
                        &local_88,pTVar14);
  }
  if ((length == 0) &&
     (TVar5 = glslang::TIntermOperator::getOp((TIntermOperator *)spec_constant_op_mode_setter._8_8_)
     , TVar5 == EOpSpirvInst)) {
    __lhs = glslang::TIntermUnary::getSpirvInstruction
                      ((TIntermUnary *)spec_constant_op_mode_setter._8_8_);
    bVar2 = std::operator==(&__lhs->set,"");
    if (bVar2) {
      spv::IdImmediate::IdImmediate
                ((IdImmediate *)
                 &literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,true,IStack_84);
      plVar12 = (long *)(**(code **)(*_lvalueCoherentFlags + 0x18))();
      pTVar13 = (TQualifier *)(**(code **)(*plVar12 + 0x108))();
      bVar2 = glslang::TQualifier::isSpirvLiteral(pTVar13);
      if (bVar2) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &constants.
                    super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                    .
                    super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        glslang::TVector<const_glslang::TIntermConstantUnion_*>::TVector
                  ((TVector<const_glslang::TIntermConstantUnion_*> *)local_148);
        local_150 = (value_type)(**(code **)(*_lvalueCoherentFlags + 0x28))();
        std::
        vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
        ::push_back((vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                     *)local_148,&local_150);
        TranslateLiterals(this,(TVector<const_glslang::TIntermConstantUnion_*> *)local_148,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &constants.
                           super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                           .
                           super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &constants.
                              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                              .
                              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        spv::IdImmediate::IdImmediate(&local_158,false,*pvVar16);
        literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_158;
        glslang::TVector<const_glslang::TIntermConstantUnion_*>::~TVector
                  ((TVector<const_glslang::TIntermConstantUnion_*> *)local_148);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &constants.
                    super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                    .
                    super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      iVar3 = (**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x100))();
      if (iVar3 == 0) {
        OVar1 = __lhs->id;
        local_188 = (IdImmediate)
                    literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage;
        local_180 = &local_188;
        local_178 = 1;
        std::allocator<spv::IdImmediate>::allocator(&local_189);
        __l_01._M_len = local_178;
        __l_01._M_array = local_180;
        std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::vector
                  (&local_170,__l_01,&local_189);
        spv::Builder::createNoResultOp(&this->builder,OVar1,&local_170);
        std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::~vector(&local_170);
        std::allocator<spv::IdImmediate>::~allocator(&local_189);
      }
      else {
        OVar1 = __lhs->id;
        IVar4 = visitUnary::anon_class_24_3_db054092::operator()
                          ((anon_class_24_3_db054092 *)&operandNode);
        local_1c0 = (IdImmediate)
                    literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage;
        local_1b8 = &local_1c0;
        local_1b0 = 1;
        std::allocator<spv::IdImmediate>::allocator(&local_1c1);
        __l_00._M_len = local_1b0;
        __l_00._M_array = local_1b8;
        std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::vector
                  (&local_1a8,__l_00,&local_1c1);
        length = spv::Builder::createOp(&this->builder,OVar1,IVar4,&local_1a8);
        std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::~vector(&local_1a8);
        std::allocator<spv::IdImmediate>::~allocator(&local_1c1);
      }
    }
    else {
      IVar4 = visitUnary::anon_class_24_3_db054092::operator()
                        ((anon_class_24_3_db054092 *)&operandNode);
      bVar2 = std::operator==(&__lhs->set,"GLSL.std.450");
      if (bVar2) {
        local_354 = this->stdBuiltins;
      }
      else {
        pcVar11 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                            (&__lhs->set);
        local_354 = getExtBuiltins(this,pcVar11);
      }
      iVar3 = __lhs->id;
      one = IStack_84;
      local_1f0 = &one;
      local_1e8 = 1;
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&op + 3));
      __l._M_len = local_1e8;
      __l._M_array = local_1f0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_1e0,__l,(allocator_type *)((long)&op + 3));
      length = spv::Builder::createBuiltinCall(&this->builder,IVar4,local_354,iVar3,&local_1e0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1e0);
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&op + 3));
    }
    iVar3 = (**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x100))();
    if (iVar3 == 0) {
      this_local._7_1_ = false;
      goto LAB_005bbb86;
    }
  }
  if (length == 0) {
    TVar5 = glslang::TIntermOperator::getOp((TIntermOperator *)spec_constant_op_mode_setter._8_8_);
    if (TVar5 - EOpPostIncrement < 4) {
      result_1 = 0;
      iVar3 = (**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x100))();
      if (iVar3 == 1) {
        result_1 = spv::Builder::makeFloatConstant(&this->builder,1.0,false);
      }
      else {
        iVar3 = (**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x100))();
        if (iVar3 == 2) {
          result_1 = spv::Builder::makeDoubleConstant(&this->builder,1.0,false);
        }
        else {
          iVar3 = (**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x100))();
          if (iVar3 == 3) {
            result_1 = spv::Builder::makeFloat16Constant(&this->builder,1.0,false);
          }
          else {
            iVar3 = (**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x100))();
            if ((iVar3 == 4) ||
               (iVar3 = (**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x100))(),
               iVar3 == 5)) {
              result_1 = spv::Builder::makeInt8Constant(&this->builder,1,false);
            }
            else {
              iVar3 = (**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x100))();
              if ((iVar3 == 6) ||
                 (iVar3 = (**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x100))(),
                 iVar3 == 7)) {
                result_1 = spv::Builder::makeInt16Constant(&this->builder,1,false);
              }
              else {
                iVar3 = (**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x100))();
                if ((iVar3 == 10) ||
                   (iVar3 = (**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x100))(),
                   iVar3 == 0xb)) {
                  result_1 = spv::Builder::makeInt64Constant(&this->builder,1,false);
                }
                else {
                  result_1 = spv::Builder::makeIntConstant(&this->builder,1,false);
                }
              }
            }
          }
        }
      }
      TVar5 = glslang::TIntermOperator::getOp((TIntermOperator *)spec_constant_op_mode_setter._8_8_)
      ;
      if ((TVar5 == EOpPreIncrement) ||
         (TVar5 = glslang::TIntermOperator::getOp
                            ((TIntermOperator *)spec_constant_op_mode_setter._8_8_),
         TVar5 == EOpPostIncrement)) {
        local_200 = EOpAdd;
      }
      else {
        local_200 = EOpSub;
      }
      TVar5 = local_200;
      pTVar14 = (TType *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0xf0))();
      typeId_00 = convertGlslangToSpvType(this,pTVar14,false);
      IVar7 = IStack_84;
      IVar4 = result_1;
      plVar12 = (long *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0xf0))();
      TVar10 = (**(code **)(*plVar12 + 0x38))();
      IVar4 = createBinaryOperation
                        (this,TVar5,(OpDecorations *)((long)&spirvInst + 4),typeId_00,IVar7,IVar4,
                         TVar10,true);
      local_204 = IVar4;
      if (IVar4 == 0) {
        __assert_fail("result != spv::NoResult",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                      ,0xb10,
                      "virtual bool (anonymous namespace)::TGlslangToSpvTraverser::visitUnary(glslang::TVisit, glslang::TIntermUnary *)"
                     );
      }
      spv::Builder::getAccessChain(&local_260,&this->builder);
      DVar9 = TranslateNonUniformDecoration(this,&local_260.coherentFlags);
      spv::Builder::accessChainStore(&this->builder,IVar4,DVar9,MaskNone,Max,0);
      spv::Builder::AccessChain::~AccessChain(&local_260);
      spv::Builder::clearAccessChain(&this->builder);
      TVar5 = glslang::TIntermOperator::getOp((TIntermOperator *)spec_constant_op_mode_setter._8_8_)
      ;
      if ((TVar5 == EOpPreIncrement) ||
         (TVar5 = glslang::TIntermOperator::getOp
                            ((TIntermOperator *)spec_constant_op_mode_setter._8_8_),
         TVar5 == EOpPreDecrement)) {
        spv::Builder::setAccessChainRValue(&this->builder,local_204);
      }
      else {
        spv::Builder::setAccessChainRValue(&this->builder,IStack_84);
      }
      this_local._7_1_ = false;
    }
    else if (TVar5 == EOpEmitStreamVertex) {
      spv::Builder::createNoResultOp(&this->builder,OpEmitStreamVertex,IStack_84);
      this_local._7_1_ = false;
    }
    else if (TVar5 == EOpEndStreamPrimitive) {
      spv::Builder::createNoResultOp(&this->builder,OpEndStreamPrimitive,IStack_84);
      this_local._7_1_ = false;
    }
    else if (TVar5 == EOpCreateTensorLayoutNV) {
      IVar4 = visitUnary::anon_class_24_3_db054092::operator()
                        ((anon_class_24_3_db054092 *)&operandNode);
      memset(&local_278,0,0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_278);
      IVar4 = spv::Builder::createOp(&this->builder,OpCreateTensorLayoutNV,IVar4,&local_278);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_278);
      spv::Builder::clearAccessChain(&this->builder);
      spv::Builder::setAccessChainRValue(&this->builder,IVar4);
      this_local._7_1_ = false;
    }
    else if (TVar5 == EOpCreateTensorViewNV) {
      IVar4 = visitUnary::anon_class_24_3_db054092::operator()
                        ((anon_class_24_3_db054092 *)&operandNode);
      memset(&local_290,0,0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_290);
      IVar4 = spv::Builder::createOp(&this->builder,OpCreateTensorViewNV,IVar4,&local_290);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_290);
      spv::Builder::clearAccessChain(&this->builder);
      spv::Builder::setAccessChainRValue(&this->builder,IVar4);
      this_local._7_1_ = false;
    }
    else if (TVar5 == EOpRayQueryTerminate) {
      spv::Builder::createNoResultOp(&this->builder,OpRayQueryTerminateKHR,IStack_84);
      this_local._7_1_ = false;
    }
    else if (TVar5 == EOpRayQueryConfirmIntersection) {
      spv::Builder::createNoResultOp(&this->builder,OpRayQueryConfirmIntersectionKHR,IStack_84);
      this_local._7_1_ = false;
    }
    else if (TVar5 == EOpHitObjectRecordEmptyNV) {
      spv::Builder::createNoResultOp(&this->builder,OpHitObjectRecordEmptyNV,IStack_84);
      this_local._7_1_ = false;
    }
    else if (TVar5 == EOpReorderThreadNV) {
      spv::Builder::createNoResultOp(&this->builder,OpReorderThreadWithHitObjectNV,IStack_84);
      this_local._7_1_ = false;
    }
    else if (TVar5 == EOpAssumeEXT) {
      spv::Builder::addCapability(&this->builder,CapabilityExpectAssumeKHR);
      spv::Builder::addExtension(&this->builder,"SPV_KHR_expect_assume");
      spv::Builder::createNoResultOp(&this->builder,OpAssumeTrueKHR,IStack_84);
      this_local._7_1_ = false;
    }
    else {
      this_00 = this->logger;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"unknown glslang unary",&local_2b1);
      spv::SpvBuildLogger::missingFunctionality(this_00,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator(&local_2b1);
      this_local._7_1_ = true;
    }
  }
  else {
    if ((Id)resultType.this != 0) {
      pTVar15 = (TIntermTyped *)(**(code **)(*(long *)spec_constant_op_mode_setter._8_8_ + 0x188))()
      ;
      length = createInvertedSwizzle(this,spirvInst._4_4_,pTVar15,length);
      anon_unknown_0::OpDecorations::addNonUniform
                ((OpDecorations *)((long)&spirvInst + 4),&this->builder,length);
    }
    spv::Builder::clearAccessChain(&this->builder);
    spv::Builder::setAccessChainRValue(&this->builder,length);
    this_local._7_1_ = false;
  }
LAB_005bbb86:
  anon_unknown_0::SpecConstantOpModeGuard::~SpecConstantOpModeGuard
            ((SpecConstantOpModeGuard *)local_38);
  return this_local._7_1_;
}

Assistant:

bool TGlslangToSpvTraverser::visitUnary(glslang::TVisit /* visit */, glslang::TIntermUnary* node)
{
    builder.setDebugSourceLocation(node->getLoc().line, node->getLoc().getFilename());

    SpecConstantOpModeGuard spec_constant_op_mode_setter(&builder);
    if (node->getType().getQualifier().isSpecConstant())
        spec_constant_op_mode_setter.turnOnSpecConstantOpMode();

    spv::Id result = spv::NoResult;

    // try texturing first
    result = createImageTextureFunctionCall(node);
    if (result != spv::NoResult) {
        builder.clearAccessChain();
        builder.setAccessChainRValue(result);

        return false; // done with this node
    }

    // Non-texturing.

    if (node->getOp() == glslang::EOpArrayLength) {
        // Quite special; won't want to evaluate the operand.

        // Currently, the front-end does not allow .length() on an array until it is sized,
        // except for the last block membeor of an SSBO.
        // TODO: If this changes, link-time sized arrays might show up here, and need their
        // size extracted.

        // Normal .length() would have been constant folded by the front-end.
        // So, this has to be block.lastMember.length().
        // SPV wants "block" and member number as the operands, go get them.

        spv::Id length;
        if (node->getOperand()->getType().isCoopMat()) {
            spv::Id typeId = convertGlslangToSpvType(node->getOperand()->getType());
            assert(builder.isCooperativeMatrixType(typeId));

            if (node->getOperand()->getType().isCoopMatKHR()) {
                length = builder.createCooperativeMatrixLengthKHR(typeId);
            } else {
                spec_constant_op_mode_setter.turnOnSpecConstantOpMode();
                length = builder.createCooperativeMatrixLengthNV(typeId);
            }
        } else if (node->getOperand()->getType().isCoopVecNV()) {
            spv::Id typeId = convertGlslangToSpvType(node->getOperand()->getType());
            length = builder.getCooperativeVectorNumComponents(typeId);
        } else {
            glslang::TIntermTyped* block = node->getOperand()->getAsBinaryNode()->getLeft();
            block->traverse(this);
            unsigned int member = node->getOperand()->getAsBinaryNode()->getRight()->getAsConstantUnion()
                ->getConstArray()[0].getUConst();
            length = builder.createArrayLength(builder.accessChainGetLValue(), member);
        }

        // GLSL semantics say the result of .length() is an int, while SPIR-V says
        // signedness must be 0. So, convert from SPIR-V unsigned back to GLSL's
        // AST expectation of a signed result.
        if (glslangIntermediate->getSource() == glslang::EShSourceGlsl) {
            if (builder.isInSpecConstCodeGenMode()) {
                length = builder.createBinOp(spv::OpIAdd, builder.makeIntType(32), length, builder.makeIntConstant(0));
            } else {
                length = builder.createUnaryOp(spv::OpBitcast, builder.makeIntType(32), length);
            }
        }

        builder.clearAccessChain();
        builder.setAccessChainRValue(length);

        return false;
    }

    // Force variable declaration - Debug Mode Only
    if (node->getOp() == glslang::EOpDeclare) {
        builder.clearAccessChain();
        node->getOperand()->traverse(this);
        builder.clearAccessChain();
        return false;
    }

    // Start by evaluating the operand

    // Does it need a swizzle inversion?  If so, evaluation is inverted;
    // operate first on the swizzle base, then apply the swizzle.
    spv::Id invertedType = spv::NoType;
    auto resultType = [&invertedType, &node, this](){ return invertedType != spv::NoType ?
        invertedType : convertGlslangToSpvType(node->getType()); };
    if (node->getOp() == glslang::EOpInterpolateAtCentroid)
        invertedType = getInvertedSwizzleType(*node->getOperand());

    builder.clearAccessChain();
    TIntermNode *operandNode;
    if (invertedType != spv::NoType)
        operandNode = node->getOperand()->getAsBinaryNode()->getLeft();
    else
        operandNode = node->getOperand();

    operandNode->traverse(this);

    spv::Id operand = spv::NoResult;

    spv::Builder::AccessChain::CoherentFlags lvalueCoherentFlags;

    const auto hitObjectOpsWithLvalue = [](glslang::TOperator op) {
        switch(op) {
            case glslang::EOpReorderThreadNV:
            case glslang::EOpHitObjectGetCurrentTimeNV:
            case glslang::EOpHitObjectGetHitKindNV:
            case glslang::EOpHitObjectGetPrimitiveIndexNV:
            case glslang::EOpHitObjectGetGeometryIndexNV:
            case glslang::EOpHitObjectGetInstanceIdNV:
            case glslang::EOpHitObjectGetInstanceCustomIndexNV:
            case glslang::EOpHitObjectGetObjectRayDirectionNV:
            case glslang::EOpHitObjectGetObjectRayOriginNV:
            case glslang::EOpHitObjectGetWorldRayDirectionNV:
            case glslang::EOpHitObjectGetWorldRayOriginNV:
            case glslang::EOpHitObjectGetWorldToObjectNV:
            case glslang::EOpHitObjectGetObjectToWorldNV:
            case glslang::EOpHitObjectGetRayTMaxNV:
            case glslang::EOpHitObjectGetRayTMinNV:
            case glslang::EOpHitObjectIsEmptyNV:
            case glslang::EOpHitObjectIsHitNV:
            case glslang::EOpHitObjectIsMissNV:
            case glslang::EOpHitObjectRecordEmptyNV:
            case glslang::EOpHitObjectGetShaderBindingTableRecordIndexNV:
            case glslang::EOpHitObjectGetShaderRecordBufferHandleNV:
            case glslang::EOpHitObjectGetClusterIdNV:
            case glslang::EOpHitObjectGetSpherePositionNV:
            case glslang::EOpHitObjectGetSphereRadiusNV:
            case glslang::EOpHitObjectIsSphereHitNV:
            case glslang::EOpHitObjectIsLSSHitNV:
                return true;
            default:
                return false;
        }
    };

    if (node->getOp() == glslang::EOpAtomicCounterIncrement ||
        node->getOp() == glslang::EOpAtomicCounterDecrement ||
        node->getOp() == glslang::EOpAtomicCounter          ||
        (node->getOp() == glslang::EOpInterpolateAtCentroid &&
          glslangIntermediate->getSource() != glslang::EShSourceHlsl)  ||
        node->getOp() == glslang::EOpRayQueryProceed        ||
        node->getOp() == glslang::EOpRayQueryGetRayTMin     ||
        node->getOp() == glslang::EOpRayQueryGetRayFlags    ||
        node->getOp() == glslang::EOpRayQueryGetWorldRayOrigin ||
        node->getOp() == glslang::EOpRayQueryGetWorldRayDirection ||
        node->getOp() == glslang::EOpRayQueryGetIntersectionCandidateAABBOpaque ||
        node->getOp() == glslang::EOpRayQueryTerminate ||
        node->getOp() == glslang::EOpRayQueryConfirmIntersection ||
        (node->getOp() == glslang::EOpSpirvInst && operandNode->getAsTyped()->getQualifier().isSpirvByReference()) ||
        hitObjectOpsWithLvalue(node->getOp())) {
        operand = builder.accessChainGetLValue(); // Special case l-value operands
        lvalueCoherentFlags = builder.getAccessChain().coherentFlags;
        lvalueCoherentFlags |= TranslateCoherent(operandNode->getAsTyped()->getType());
    } else if (operandNode->getAsTyped()->getQualifier().isSpirvLiteral()) {
        // Will be translated to a literal value, make a placeholder here
        operand = spv::NoResult;
    } else {
        operand = accessChainLoad(node->getOperand()->getType());
    }

    OpDecorations decorations = { TranslatePrecisionDecoration(node->getOperationPrecision()),
                                  TranslateNoContractionDecoration(node->getType().getQualifier()),
                                  TranslateNonUniformDecoration(node->getType().getQualifier()) };

    // it could be a conversion
    if (! result) {
        result = createConversion(node->getOp(), decorations, resultType(), operand,
            node->getType().getBasicType(), node->getOperand()->getBasicType());
        if (result) {
            if (node->getType().isCoopMatKHR() && node->getOperand()->getAsTyped()->getType().isCoopMatKHR() &&
                !node->getAsTyped()->getType().sameCoopMatUse(node->getOperand()->getAsTyped()->getType())) {
                // Conversions that change use need CapabilityCooperativeMatrixConversionsNV
                builder.addCapability(spv::CapabilityCooperativeMatrixConversionsNV);
                builder.addExtension(spv::E_SPV_NV_cooperative_matrix2);
            }
        }
    }

    // if not, then possibly an operation
    if (! result)
        result = createUnaryOperation(node->getOp(), decorations, resultType(), operand,
            node->getOperand()->getBasicType(), lvalueCoherentFlags, node->getType());

    // it could be attached to a SPIR-V intruction
    if (!result) {
        if (node->getOp() == glslang::EOpSpirvInst) {
            const auto& spirvInst = node->getSpirvInstruction();
            if (spirvInst.set == "") {
                spv::IdImmediate idImmOp = {true, operand};
                if (operandNode->getAsTyped()->getQualifier().isSpirvLiteral()) {
                    // Translate the constant to a literal value
                    std::vector<unsigned> literals;
                    glslang::TVector<const glslang::TIntermConstantUnion*> constants;
                    constants.push_back(operandNode->getAsConstantUnion());
                    TranslateLiterals(constants, literals);
                    idImmOp = {false, literals[0]};
                }

                if (node->getBasicType() == glslang::EbtVoid)
                    builder.createNoResultOp(static_cast<spv::Op>(spirvInst.id), {idImmOp});
                else
                    result = builder.createOp(static_cast<spv::Op>(spirvInst.id), resultType(), {idImmOp});
            } else {
                result = builder.createBuiltinCall(
                    resultType(), spirvInst.set == "GLSL.std.450" ? stdBuiltins : getExtBuiltins(spirvInst.set.c_str()),
                    spirvInst.id, {operand});
            }

            if (node->getBasicType() == glslang::EbtVoid)
                return false; // done with this node
        }
    }

    if (result) {
        if (invertedType) {
            result = createInvertedSwizzle(decorations.precision, *node->getOperand(), result);
            decorations.addNonUniform(builder, result);
        }

        builder.clearAccessChain();
        builder.setAccessChainRValue(result);

        return false; // done with this node
    }

    // it must be a special case, check...
    switch (node->getOp()) {
    case glslang::EOpPostIncrement:
    case glslang::EOpPostDecrement:
    case glslang::EOpPreIncrement:
    case glslang::EOpPreDecrement:
        {
            // we need the integer value "1" or the floating point "1.0" to add/subtract
            spv::Id one = 0;
            if (node->getBasicType() == glslang::EbtFloat)
                one = builder.makeFloatConstant(1.0F);
            else if (node->getBasicType() == glslang::EbtDouble)
                one = builder.makeDoubleConstant(1.0);
            else if (node->getBasicType() == glslang::EbtFloat16)
                one = builder.makeFloat16Constant(1.0F);
            else if (node->getBasicType() == glslang::EbtInt8  || node->getBasicType() == glslang::EbtUint8)
                one = builder.makeInt8Constant(1);
            else if (node->getBasicType() == glslang::EbtInt16 || node->getBasicType() == glslang::EbtUint16)
                one = builder.makeInt16Constant(1);
            else if (node->getBasicType() == glslang::EbtInt64 || node->getBasicType() == glslang::EbtUint64)
                one = builder.makeInt64Constant(1);
            else
                one = builder.makeIntConstant(1);
            glslang::TOperator op;
            if (node->getOp() == glslang::EOpPreIncrement ||
                node->getOp() == glslang::EOpPostIncrement)
                op = glslang::EOpAdd;
            else
                op = glslang::EOpSub;

            spv::Id result = createBinaryOperation(op, decorations,
                                                   convertGlslangToSpvType(node->getType()), operand, one,
                                                   node->getType().getBasicType());
            assert(result != spv::NoResult);

            // The result of operation is always stored, but conditionally the
            // consumed result.  The consumed result is always an r-value.
            builder.accessChainStore(result,
                                     TranslateNonUniformDecoration(builder.getAccessChain().coherentFlags));
            builder.clearAccessChain();
            if (node->getOp() == glslang::EOpPreIncrement ||
                node->getOp() == glslang::EOpPreDecrement)
                builder.setAccessChainRValue(result);
            else
                builder.setAccessChainRValue(operand);
        }

        return false;

    case glslang::EOpAssumeEXT:
        builder.addCapability(spv::CapabilityExpectAssumeKHR);
        builder.addExtension(spv::E_SPV_KHR_expect_assume);
        builder.createNoResultOp(spv::OpAssumeTrueKHR, operand);
        return false;
    case glslang::EOpEmitStreamVertex:
        builder.createNoResultOp(spv::OpEmitStreamVertex, operand);
        return false;
    case glslang::EOpEndStreamPrimitive:
        builder.createNoResultOp(spv::OpEndStreamPrimitive, operand);
        return false;
    case glslang::EOpRayQueryTerminate:
        builder.createNoResultOp(spv::OpRayQueryTerminateKHR, operand);
        return false;
    case glslang::EOpRayQueryConfirmIntersection:
        builder.createNoResultOp(spv::OpRayQueryConfirmIntersectionKHR, operand);
        return false;
    case glslang::EOpReorderThreadNV:
        builder.createNoResultOp(spv::OpReorderThreadWithHitObjectNV, operand);
        return false;
    case glslang::EOpHitObjectRecordEmptyNV:
        builder.createNoResultOp(spv::OpHitObjectRecordEmptyNV, operand);
        return false;

    case glslang::EOpCreateTensorLayoutNV:
        result = builder.createOp(spv::OpCreateTensorLayoutNV, resultType(), std::vector<spv::Id>{});
        builder.clearAccessChain();
        builder.setAccessChainRValue(result);
        return false;

    case glslang::EOpCreateTensorViewNV:
        result = builder.createOp(spv::OpCreateTensorViewNV, resultType(), std::vector<spv::Id>{});
        builder.clearAccessChain();
        builder.setAccessChainRValue(result);
        return false;

    default:
        logger->missingFunctionality("unknown glslang unary");
        return true;  // pick up operand as placeholder result
    }
}